

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaped_array_view.hpp
# Opt level: O2

shaped_array_view<long,_2UL> * __thiscall
burst::make_shaped_array_view<long,unsigned_long,2ul>
          (shaped_array_view<long,_2UL> *__return_storage_ptr__,burst *this,long *data,
          array<unsigned_long,_2UL> shape)

{
  long *local_48;
  unsigned_long uStack_40;
  undefined1 local_38 [8];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  
  uStack_40 = shape._M_elems[0];
  local_28 = (undefined1 *)&local_48;
  local_30 = local_38;
  local_48 = data;
  local_20 = local_30;
  std::
  partial_sum<std::reverse_iterator<unsigned_long*>,std::reverse_iterator<unsigned_long*>,std::multiplies<void>>
            (local_38);
  (__return_storage_ptr__->super_shaped_array_view_base<long,_2UL>).data = (long *)this;
  (__return_storage_ptr__->super_shaped_array_view_base<long,_2UL>).shape._M_elems[0] =
       (unsigned_long)local_48;
  (__return_storage_ptr__->super_shaped_array_view_base<long,_2UL>).shape._M_elems[1] = uStack_40;
  return __return_storage_ptr__;
}

Assistant:

auto make_shaped_array_view (Value * data, std::array<Integer, Dimension> shape)
    {
        static_assert(Dimension > 0, "Размерность массива должна быть положительной");
        std::partial_sum(shape.rbegin(), shape.rend(), shape.rbegin(), std::multiplies<>{});
        return shaped_array_view<Value, Dimension>(data, detail::cast<std::size_t>(shape));
    }